

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::ClassNamePrefix<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,string *classname,Descriptor *desc)

{
  long *plVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  
  plVar1 = *(long **)(*(long *)(*(long *)(desc + 0x10) + 0xa0) + 0x98);
  iVar2 = std::__cxx11::string::compare((char *)plVar1);
  if (iVar2 == 0) {
    lVar5 = 0;
    do {
      iVar2 = std::__cxx11::string::compare((char *)classname);
      if (iVar2 == 0) {
        iVar2 = std::__cxx11::string::compare(*(char **)(*(long *)(desc + 0x10) + 8));
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (iVar2 == 0) {
          pcVar4 = "GPB";
        }
        else {
          pcVar4 = "PB";
        }
        pcVar3 = "";
        goto LAB_0023c500;
      }
      lVar5 = lVar5 + 8;
    } while (lVar5 == 8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "";
    pcVar4 = "";
LAB_0023c500:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNamePrefix(const string& classname,
                            const DescriptorType* desc) {
  const string& prefix = (desc->file()->options()).php_class_prefix();
  if (prefix != "") {
    return prefix;
  }

  bool is_reserved = false;

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (classname == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  if (is_reserved) {
    if (desc->file()->package() == "google.protobuf") {
      return "GPB";
    } else {
      return "PB";
    }
  }

  return "";
}